

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

bool Omega_h::operator==(Read<double> *a,Read<double> *b)

{
  int *piVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  type transform;
  Alloc *local_30;
  Alloc *local_20;
  
  local_30 = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_30 & 1) == 0) {
    uVar3 = local_30->size;
  }
  else {
    uVar3 = (ulong)local_30 >> 3;
  }
  local_20 = (b->write_).shared_alloc_.alloc;
  if (((ulong)local_20 & 1) == 0) {
    sVar4 = local_20->size;
  }
  else {
    sVar4 = (ulong)local_20 >> 3;
  }
  if ((int)(uVar3 >> 3) == (int)(sVar4 >> 3)) {
    if (((ulong)local_30 & 1) == 0) {
      uVar3 = local_30->size;
    }
    else {
      uVar3 = (ulong)local_30 >> 3;
    }
    if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_30 = (Alloc *)(local_30->size * 8 + 1);
      }
      else {
        local_30->use_count = local_30->use_count + 1;
      }
    }
    if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_20 = (Alloc *)(local_20->size * 8 + 1);
      }
      else {
        local_20->use_count = local_20->use_count + 1;
      }
    }
    bVar2 = operator==(0,uVar3 >> 3 & 0xffffffff,1);
    if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
      piVar1 = &local_20->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_20);
        operator_delete(local_20,0x48);
      }
    }
    if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
      piVar1 = &local_30->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30);
        operator_delete(local_30,0x48);
      }
    }
    return bVar2;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xd);
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}